

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O2

bool __thiscall
BamTools::PropertyFilterValue::check<signed_char>(PropertyFilterValue *this,char *query)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  
  bVar2 = Variant::is_type<signed_char>(&this->Value);
  if (bVar2) {
    bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
    if (bVar2) {
      pcVar4 = "Cannot compare different types - query is a string!";
      goto LAB_00171c4f;
    }
    switch(this->Type) {
    case EXACT:
      cVar1 = *query;
      pcVar4 = Variant::get<signed_char>(&this->Value);
      bVar2 = cVar1 == *pcVar4;
      break;
    case GREATER_THAN:
      cVar1 = *query;
      pcVar4 = Variant::get<signed_char>(&this->Value);
      bVar2 = *pcVar4 < cVar1;
      break;
    case GREATER_THAN_EQUAL:
      cVar1 = *query;
      pcVar4 = Variant::get<signed_char>(&this->Value);
      bVar2 = *pcVar4 <= cVar1;
      break;
    case LESS_THAN:
      cVar1 = *query;
      pcVar4 = Variant::get<signed_char>(&this->Value);
      bVar2 = cVar1 < *pcVar4;
      break;
    case LESS_THAN_EQUAL:
      cVar1 = *query;
      pcVar4 = Variant::get<signed_char>(&this->Value);
      bVar2 = cVar1 <= *pcVar4;
      break;
    case NOT:
      cVar1 = *query;
      pcVar4 = Variant::get<signed_char>(&this->Value);
      bVar2 = cVar1 != *pcVar4;
      break;
    default:
      goto switchD_00171c7c_default;
    }
  }
  else {
    pcVar4 = "Cannot compare different types!";
LAB_00171c4f:
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
switchD_00171c7c_default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}